

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O0

void test_2d_dynamic<2ul,2ul,30ul,30ul>(void)

{
  value_type vVar1;
  value_type vVar2;
  int *piVar3;
  ulong uVar4;
  value_type vVar5;
  value_type vVar6;
  size_type sVar7;
  reference pvVar8;
  long lVar9;
  bool bVar10;
  int local_208 [4];
  dynamic_dims_array local_1f8;
  dynamic_dims_array local_1e8;
  size_type local_1d8;
  unsigned_long local_1d0;
  value_type true_idx_1;
  int i_1;
  int j_1;
  int *local_1b8;
  int *local_1b0;
  size_type local_1a8;
  unsigned_long local_1a0;
  value_type true_idx;
  dimensions<18446744073709551615UL,_18446744073709551615UL> s;
  int i;
  int j;
  int *dptr;
  allocator<int> local_165;
  value_type_conflict1 local_164;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_140;
  unsigned_long local_138;
  size_type local_130;
  unsigned_long local_128;
  size_type local_120;
  unsigned_long local_118;
  size_type local_110;
  bool local_103;
  bool local_102;
  dimensions<0UL,_0UL> local_101;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_100;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_f0;
  undefined1 local_e0 [8];
  layout_mapping_left<dimensions<dyn,_dyn>,_dimensions<dyn,_dyn>,_dimensions<0,_0>_> sub_l;
  size_type local_a0;
  unsigned_long local_98;
  size_type local_90;
  int local_84;
  size_type local_80;
  int local_74;
  size_type local_70;
  bool local_63;
  bool local_62;
  dimensions<0UL,_0UL> local_61;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_60;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_50;
  undefined1 local_40 [8];
  layout_mapping_left<dimensions<dyn,_dyn>,_dimensions<dyn,_dyn>,_dimensions<0,_0>_> l;
  
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_50,0x1e,0x1e);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<int,_int,_nullptr>(&local_60,1,1);
  std::experimental::dimensions<0UL,_0UL>::dimensions(&local_61);
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  ::layout_mapping_regular_precomputed_strides
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              *)local_40,local_50.dynamic_dims_._M_elems[0],local_50.dynamic_dims_._M_elems[1],
             local_60.dynamic_dims_._M_elems[0],local_60.dynamic_dims_._M_elems[1]);
  local_62 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::is_regular();
  local_63 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x10f,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_62,
             &local_63);
  local_70 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_40,0);
  local_74 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x111,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_70,
             &local_74);
  local_80 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                       *)local_40,1);
  local_84 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x112,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_80,
             &local_84);
  local_90 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40);
  local_98 = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x114,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_90,
             &local_98);
  local_a0 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
             ::span((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_40);
  sub_l.stride_.dynamic_dims_._M_elems[1] = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x115,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_a0,
             sub_l.stride_.dynamic_dims_._M_elems + 1);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_f0,0xf,0xf);
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_nullptr>(&local_100,2,2);
  std::experimental::dimensions<0UL,_0UL>::dimensions(&local_101);
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
  ::layout_mapping_regular_precomputed_strides
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              *)local_e0,local_f0.dynamic_dims_._M_elems[0],local_f0.dynamic_dims_._M_elems[1],
             local_100.dynamic_dims_._M_elems[0],local_100.dynamic_dims_._M_elems[1]);
  local_102 = std::experimental::detail::
              layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::is_regular();
  local_103 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11b,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_102,
             &local_103);
  local_110 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                        *)local_e0,0);
  local_118 = 2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11d,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_110,
             &local_118);
  local_120 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                        *)local_e0,1);
  local_128 = 2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x11e,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_120,
             &local_128);
  local_130 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::size
                        ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0);
  local_138 = 0xe1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x120,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_130,
             &local_138);
  local_140 = std::experimental::detail::
              layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
              ::span((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                      *)local_e0);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x121,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_140,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40,0);
  vVar2 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40,1);
  local_164 = 0x2a;
  std::allocator<int>::allocator(&local_165);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_160,vVar1 * vVar2,&local_164,&local_165);
  std::allocator<int>::~allocator(&local_165);
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_160);
  s.dynamic_dims_._M_elems[1]._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)s.dynamic_dims_._M_elems[1]._4_4_;
    vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0,1
                           );
    if (vVar1 <= uVar4) break;
    s.dynamic_dims_._M_elems[1]._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(int)s.dynamic_dims_._M_elems[1];
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0
                              ,0);
      if (vVar1 <= uVar4) break;
      _true_idx = (_Type)std::experimental::detail::
                         layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                         ::steps((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                  *)local_e0);
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      lVar9 = (long)(int)s.dynamic_dims_._M_elems[1];
      vVar2 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_e0
                              ,0);
      vVar5 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,0);
      vVar6 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &true_idx,1);
      local_1a0 = vVar1 * lVar9 + vVar2 * vVar5 * vVar6 * (long)s.dynamic_dims_._M_elems[1]._4_4_;
      local_1a8 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_e0,(int)s.dynamic_dims_._M_elems[1],
                                   s.dynamic_dims_._M_elems[1]._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x12e,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_1a8,
                 &local_1a0);
      sVar7 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_e0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      local_1b0 = piVar3 + sVar7;
      local_1b8 = piVar3 + local_1a0;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x130,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_1b0,
                 &local_1b8);
      sVar7 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_e0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      piVar3[sVar7] = 0x11;
      sVar7 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_e0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      j_1 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x134,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",
                 piVar3 + sVar7,&j_1);
      sVar7 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
              ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                *)local_e0,(int)s.dynamic_dims_._M_elems[1],
                               s.dynamic_dims_._M_elems[1]._4_4_);
      pvVar8 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)local_160,sVar7);
      i_1 = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x137,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",pvVar8,&i_1)
      ;
      s.dynamic_dims_._M_elems[1]._0_4_ = (int)s.dynamic_dims_._M_elems[1] + 1;
    }
    s.dynamic_dims_._M_elems[1]._4_4_ = s.dynamic_dims_._M_elems[1]._4_4_ + 1;
  }
  true_idx_1._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)true_idx_1._4_4_;
    vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40,1
                           );
    if (vVar1 <= uVar4) break;
    true_idx_1._0_4_ = 0;
    while( true ) {
      uVar4 = (ulong)(int)true_idx_1;
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40
                              ,0);
      if (vVar1 <= uVar4) break;
      lVar9 = (long)(int)true_idx_1;
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)local_40
                              ,0);
      local_1d0 = lVar9 + vVar1 * (long)true_idx_1._4_4_;
      local_1d8 = std::experimental::
                  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                  ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                    *)local_40,(int)true_idx_1,true_idx_1._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x140,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",&local_1d8,
                 &local_1d0);
      uVar4 = (ulong)(int)true_idx_1;
      local_1e8._M_elems =
           (_Type)std::experimental::detail::
                  layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                  ::steps((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                           *)local_e0);
      vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                              &local_1e8,0);
      bVar10 = false;
      if (uVar4 % vVar1 == 0) {
        uVar4 = (ulong)true_idx_1._4_4_;
        local_1f8._M_elems =
             (_Type)std::experimental::detail::
                    layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                    ::steps((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>
                             *)local_e0);
        vVar1 = std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL> *)
                                &local_1f8,1);
        bVar10 = uVar4 % vVar1 == 0;
      }
      if (bVar10) {
        sVar7 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_40,(int)true_idx_1,true_idx_1._4_4_);
        local_208[3] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0x147,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",
                   piVar3 + sVar7,local_208 + 3);
        sVar7 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_40,(int)true_idx_1,true_idx_1._4_4_);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_160,sVar7);
        local_208[2] = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0x14a,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",pvVar8,
                   local_208 + 2);
      }
      else {
        sVar7 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_40,(int)true_idx_1,true_idx_1._4_4_);
        local_208[1] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0x14f,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",
                   piVar3 + sVar7,local_208 + 1);
        sVar7 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                ::index<int,int>((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)local_40,(int)true_idx_1,true_idx_1._4_4_);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at
                           ((vector<int,_std::allocator<int>_> *)local_160,sVar7);
        local_208[0] = 0x2a;
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","42",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                   ,0x152,"void test_2d_dynamic() [N = 2UL, M = 2UL, X = 30UL, Y = 30UL]",pvVar8,
                   local_208);
      }
      true_idx_1._0_4_ = (int)true_idx_1 + 1;
    }
    true_idx_1._4_4_ = true_idx_1._4_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_160);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0>
    > const l{{X, Y}, {1, 1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_left<
        dimensions<dyn, dyn>, dimensions<dyn, dyn>, dimensions<0, 0> 
    > const sub_l{{X / N, Y / M}, {N, M}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    // Initialize all elements to 42.
    std::vector<int> data(l[0] * l[1], 42);
    int* dptr = data.data();

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.steps()[0]))
           && (0 == (j % sub_l.steps()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
        }
    }
}